

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

void __thiscall
Assimp::OptimizeMeshesProcess::ProcessNode(OptimizeMeshesProcess *this,aiNode *pNode)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  uint local_64;
  iterator iStack_60;
  uint i_1;
  const_iterator local_58;
  __normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_50;
  const_iterator local_48;
  aiMesh *local_40;
  aiMesh *out;
  uint am;
  uint a;
  uint faces;
  uint verts;
  uint *im;
  aiNode *paStack_18;
  uint i;
  aiNode *pNode_local;
  OptimizeMeshesProcess *this_local;
  
  paStack_18 = pNode;
  pNode_local = (aiNode *)this;
  for (im._4_4_ = 0; im._4_4_ < paStack_18->mNumMeshes; im._4_4_ = im._4_4_ + 1) {
    _faces = paStack_18->mMeshes + im._4_4_;
    pvVar2 = std::
             vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
             ::operator[](&this->meshes,(ulong)*_faces);
    if (pvVar2->instance_cnt < 2) {
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::resize(&this->merge_list,0);
      a = 0;
      am = 0;
      out._4_4_ = im._4_4_;
      while (out._4_4_ = out._4_4_ + 1, out._4_4_ < paStack_18->mNumMeshes) {
        out._0_4_ = paStack_18->mMeshes[out._4_4_];
        pvVar2 = std::
                 vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
                 ::operator[](&this->meshes,(ulong)(uint)out);
        if ((pvVar2->instance_cnt == 1) && (bVar1 = CanJoin(this,*_faces,(uint)out,a,am), bVar1)) {
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    (&this->merge_list,this->mScene->mMeshes + (uint)out);
          a = this->mScene->mMeshes[(uint)out]->mNumVertices + a;
          am = this->mScene->mMeshes[(uint)out]->mNumFaces + am;
          paStack_18->mMeshes[out._4_4_] = paStack_18->mMeshes[paStack_18->mNumMeshes - 1];
          paStack_18->mNumMeshes = paStack_18->mNumMeshes - 1;
          out._4_4_ = out._4_4_ - 1;
        }
      }
      bVar1 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::empty(&this->merge_list);
      if (bVar1) {
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  (&this->output,this->mScene->mMeshes + *_faces);
      }
      else {
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  (&this->merge_list,this->mScene->mMeshes + *_faces);
        local_50._M_current =
             (aiMesh **)std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin(&this->merge_list);
        __gnu_cxx::__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>>::
        __normal_iterator<aiMesh**>
                  ((__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>> *)
                   &local_48,&local_50);
        iStack_60 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end(&this->merge_list);
        __gnu_cxx::__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>>::
        __normal_iterator<aiMesh**>
                  ((__normal_iterator<aiMesh*const*,std::vector<aiMesh*,std::allocator<aiMesh*>>> *)
                   &local_58,&stack0xffffffffffffffa0);
        SceneCombiner::MergeMeshes(&local_40,0,local_48,local_58);
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&this->output,&local_40);
      }
      sVar3 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size(&this->output);
      *_faces = (int)sVar3 - 1;
    }
    else {
      pvVar2 = std::
               vector<Assimp::OptimizeMeshesProcess::MeshInfo,_std::allocator<Assimp::OptimizeMeshesProcess::MeshInfo>_>
               ::operator[](&this->meshes,(ulong)*_faces);
      *_faces = pvVar2->output_id;
    }
  }
  for (local_64 = 0; local_64 < paStack_18->mNumChildren; local_64 = local_64 + 1) {
    ProcessNode(this,paStack_18->mChildren[local_64]);
  }
  return;
}

Assistant:

void OptimizeMeshesProcess::ProcessNode( aiNode* pNode)
{
    for (unsigned int i = 0; i < pNode->mNumMeshes;++i) {
        unsigned int& im = pNode->mMeshes[i];

        if (meshes[im].instance_cnt > 1) {
            im = meshes[im].output_id;
        }
        else  {
            merge_list.resize( 0 );
            unsigned int verts = 0, faces = 0;

            // Find meshes to merge with us
            for (unsigned int a = i+1; a < pNode->mNumMeshes;++a) {
                unsigned int am = pNode->mMeshes[a];
                if (meshes[am].instance_cnt == 1 && CanJoin(im,am,verts,faces)) {

                    merge_list.push_back(mScene->mMeshes[am]);
                    verts += mScene->mMeshes[am]->mNumVertices;
                    faces += mScene->mMeshes[am]->mNumFaces;

                    pNode->mMeshes[a] = pNode->mMeshes[pNode->mNumMeshes - 1];
                    --pNode->mNumMeshes;
                    --a;
                }
            }

            // and merge all meshes which we found, replace the old ones
            if (!merge_list.empty()) {
                merge_list.push_back(mScene->mMeshes[im]);

                aiMesh* out;
                SceneCombiner::MergeMeshes(&out,0,merge_list.begin(),merge_list.end());
                output.push_back(out);
            } else {
                output.push_back(mScene->mMeshes[im]);
            }
            im = static_cast<unsigned int>(output.size()-1);
        }
    }


    for( unsigned int i = 0; i < pNode->mNumChildren; ++i ) {
        ProcessNode( pNode->mChildren[ i ] );
    }
}